

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O3

uint32_t __thiscall
booster::locale::util::base_converter::from_unicode
          (base_converter *this,uint32_t u,char *begin,char *end)

{
  uint32_t uVar1;
  
  if (begin != end) {
    uVar1 = 0xffffffff;
    if (u < 0x80) {
      *begin = (char)u;
      uVar1 = 1;
    }
    return uVar1;
  }
  return 0xfffffffe;
}

Assistant:

virtual uint32_t from_unicode(uint32_t u,char *begin,char const *end) 
        {
            if(begin==end)
                return incomplete;
            if(u >= 0x80)
                return illegal;
            *begin = static_cast<char>(u);
            return 1;
        }